

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O3

Field __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateField
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Type TVar3;
  ulong uVar4;
  Field FVar5;
  
  uVar1 = Random::upTo(this->rand,2);
  uVar2 = Random::upTo(this->rand,6);
  if (uVar2 == 0) {
    uVar2 = Random::upTo(this->rand,2);
    TVar3.id = 2;
    uVar4 = 2 - (ulong)(uVar2 == 0);
  }
  else {
    TVar3 = generateSingleType(this,share);
    uVar4 = 0;
  }
  FVar5._8_8_ = (ulong)(uVar1 == 0) << 0x20 | uVar4;
  FVar5.type.id = TVar3.id;
  return FVar5;
}

Assistant:

Field generateField(Shareability share) {
    auto mutability = rand.oneIn(2) ? Mutable : Immutable;
    if (rand.oneIn(6)) {
      return {rand.oneIn(2) ? Field::i8 : Field::i16, mutability};
    } else {
      return {generateSingleType(share), mutability};
    }
  }